

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O2

vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
* libcellml::getImportedComponents
            (vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
             *__return_storage_ptr__,ComponentEntityConstPtr *componentEntity)

{
  bool bVar1;
  size_t sVar2;
  ulong uVar3;
  vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
  childImportedComponents;
  ComponentPtr component;
  vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
  local_68;
  __shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<libcellml::ComponentEntity_const,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar3 = 0;
  while( true ) {
    sVar2 = ComponentEntity::componentCount
                      ((componentEntity->
                       super___shared_ptr<const_libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr);
    if (sVar2 <= uVar3) break;
    ComponentEntity::component
              ((ComponentEntity *)&local_50,
               (size_t)(componentEntity->
                       super___shared_ptr<const_libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr);
    bVar1 = ImportedEntity::isImport(&(local_50._M_ptr)->super_ImportedEntity);
    if (bVar1) {
      std::
      vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)&local_50);
    }
    std::__shared_ptr<libcellml::ComponentEntity_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libcellml::Component,void>(local_40,&local_50);
    getImportedComponents(&local_68,(ComponentEntityConstPtr *)local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
    std::
    vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
    ::reserve(__return_storage_ptr__,
              ((long)local_68.
                     super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_68.
                     super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) +
              ((long)(__return_storage_ptr__->
                     super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(__return_storage_ptr__->
                     super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 4));
    std::
    vector<std::shared_ptr<libcellml::Component>,std::allocator<std::shared_ptr<libcellml::Component>>>
    ::
    insert<__gnu_cxx::__normal_iterator<std::shared_ptr<libcellml::Component>*,std::vector<std::shared_ptr<libcellml::Component>,std::allocator<std::shared_ptr<libcellml::Component>>>>,void>
              ((vector<std::shared_ptr<libcellml::Component>,std::allocator<std::shared_ptr<libcellml::Component>>>
                *)__return_storage_ptr__,
               (__return_storage_ptr__->
               super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
               )._M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<std::shared_ptr<libcellml::Component>_*,_std::vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>_>
                )local_68.
                 super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<std::shared_ptr<libcellml::Component>_*,_std::vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>_>
                )local_68.
                 super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
    ::~vector(&local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    uVar3 = uVar3 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<ComponentPtr> getImportedComponents(const ComponentEntityConstPtr &componentEntity)
{
    std::vector<ComponentPtr> importedComponents;
    for (size_t i = 0; i < componentEntity->componentCount(); ++i) {
        auto component = componentEntity->component(i);
        if (component->isImport()) {
            importedComponents.push_back(component);
        }

        auto childImportedComponents = getImportedComponents(component);
        importedComponents.reserve(importedComponents.size() + childImportedComponents.size());
        importedComponents.insert(importedComponents.end(), childImportedComponents.begin(), childImportedComponents.end());
    }

    return importedComponents;
}